

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void utf::testUtf8Encode(void)

{
  ulong in_RAX;
  uint64_t uVar1;
  uint64_t uVar2;
  utf32_t c;
  int iVar3;
  utf32_t c_1;
  size_t i;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  anon_union_4_2_43ac0e16 utf8 [2];
  undefined8 local_28;
  
  local_28 = in_RAX;
  puts("verifying...");
  for (iVar3 = 0; iVar3 != 0x200000; iVar3 = iVar3 + 1) {
    local_28 = 0;
    encodeCodePoint((utf8_t *)&local_28,iVar3);
    encodeCodePoint_old((utf8_t *)((long)&local_28 + 4),iVar3);
    g_v = local_28._4_4_;
  }
  puts("done");
  printf("original...");
  uVar1 = axl::sys::getPreciseTimestamp();
  for (lVar4 = 0; lVar4 != 500000; lVar4 = lVar4 + 1) {
    for (iVar3 = 0; iVar3 != 0x800; iVar3 = iVar3 + 1) {
      local_28 = local_28 & 0xffffffff00000000;
      encodeCodePoint_old((utf8_t *)&local_28,iVar3);
      g_v = (undefined4)local_28;
    }
  }
  uVar2 = axl::sys::getPreciseTimestamp();
  lVar4 = uVar2 - uVar1;
  auVar5._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar5._0_8_ = lVar4;
  auVar5._12_4_ = 0x45300000;
  printf("done, %.3f sec\n",
         ((auVar5._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) / 10000000.0);
  printf("new........");
  uVar1 = axl::sys::getPreciseTimestamp();
  for (lVar4 = 0; lVar4 != 500000; lVar4 = lVar4 + 1) {
    for (iVar3 = 0; iVar3 != 0x800; iVar3 = iVar3 + 1) {
      local_28 = local_28 & 0xffffffff00000000;
      encodeCodePoint((utf8_t *)&local_28,iVar3);
      g_v = (undefined4)local_28;
    }
  }
  uVar2 = axl::sys::getPreciseTimestamp();
  lVar4 = uVar2 - uVar1;
  auVar6._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar6._0_8_ = lVar4;
  auVar6._12_4_ = 0x45300000;
  printf("done, %.3f sec\n",
         ((auVar6._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) / 10000000.0);
  return;
}

Assistant:

void
testUtf8Encode() {
	union {
		utf8_t m_c[4];
		uint32_t m_x;
	} utf8[2];

	printf("verifying...\n");

	for (utf32_t c = 0; c < 0x200000; c++) {
		utf8[0].m_x = 0;
		utf8[1].m_x = 0;

		encodeCodePoint(utf8[0].m_c, c);
		encodeCodePoint_old(utf8[1].m_c, c);
		ASSERT(utf8[0].m_x == utf8[1].m_x);
		g_v = utf8[0].m_x;
		g_v = utf8[1].m_x;
	}

	printf("done\n");

	enum {
//		LoopCount = 500,
//		MaxChar   = 0x200000,

//		LoopCount = 5000,
//		MaxChar   = 0x10000,

		LoopCount = 500000,
		MaxChar   = 0x800,
	};

	printf("original...");

	uint64_t time = sys::getPreciseTimestamp();

	for (size_t i = 0; i < LoopCount; i++)
		for (utf32_t c = 0; c < MaxChar; c++) {
			utf8[0].m_x = 0;
			encodeCodePoint_old(utf8[0].m_c, c);
			g_v = utf8[0].m_x;
		}

	time = sys::getPreciseTimestamp() - time;

	printf("done, %.3f sec\n", (double)time / 10000000);

	printf("new........");

	time = sys::getPreciseTimestamp();

	for (size_t i = 0; i < LoopCount; i++)
		for (utf32_t c = 0; c < MaxChar; c++) {
			utf8[0].m_x = 0;
			encodeCodePoint(utf8[0].m_c, c);
			g_v = utf8[0].m_x;
		}

	time = sys::getPreciseTimestamp() - time;

	printf("done, %.3f sec\n", (double)time / 10000000);
}